

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

ImPlotColormap ImPlot::AddColormap(char *name,ImU32 *colormap,int size,bool qual)

{
  ImPlotColormap IVar1;
  int iVar2;
  ImPlotColormapData *this;
  
  if (size < 2) {
    __assert_fail("(size > 1) && \"The colormap size must be greater than 1!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xd02,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImU32 *, int, bool)");
  }
  this = &GImPlot->ColormapData;
  IVar1 = ImPlotColormapData::GetIndex(this,name);
  if (IVar1 == -1) {
    iVar2 = ImPlotColormapData::Append(this,name,colormap,size,qual);
    return iVar2;
  }
  __assert_fail("(gp.ColormapData.GetIndex(name) == -1) && \"The colormap name has already be used!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xd03,"ImPlotColormap ImPlot::AddColormap(const char *, const ImU32 *, int, bool)")
  ;
}

Assistant:

ImPlotColormap AddColormap(const char* name, const ImU32*  colormap, int size, bool qual) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(size > 1, "The colormap size must be greater than 1!");
    IM_ASSERT_USER_ERROR(gp.ColormapData.GetIndex(name) == -1, "The colormap name has already be used!");
    return gp.ColormapData.Append(name, colormap, size, qual);
}